

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

char * param2text(ParameterError error)

{
  char *pcStack_10;
  ParameterError error_local;
  
  switch(error) {
  case PARAM_OPTION_AMBIGUOUS:
    pcStack_10 = "is ambiguous";
    break;
  case PARAM_OPTION_UNKNOWN:
    pcStack_10 = "is unknown";
    break;
  case PARAM_REQUIRES_PARAMETER:
    pcStack_10 = "requires parameter";
    break;
  case PARAM_BAD_USE:
    pcStack_10 = "is badly used here";
    break;
  default:
    pcStack_10 = "unknown error";
    break;
  case PARAM_GOT_EXTRA_PARAMETER:
    pcStack_10 = "had unsupported trailing garbage";
    break;
  case PARAM_BAD_NUMERIC:
    pcStack_10 = "expected a proper numerical parameter";
    break;
  case PARAM_NEGATIVE_NUMERIC:
    pcStack_10 = "expected a positive numerical parameter";
    break;
  case PARAM_LIBCURL_DOESNT_SUPPORT:
    pcStack_10 = "the installed libcurl version does not support this";
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    pcStack_10 = "a specified protocol is unsupported by libcurl";
    break;
  case PARAM_NO_MEM:
    pcStack_10 = "out of memory";
    break;
  case PARAM_NO_PREFIX:
    pcStack_10 = "the given option cannot be reversed with a --no- prefix";
    break;
  case PARAM_NUMBER_TOO_LARGE:
    pcStack_10 = "too large number";
    break;
  case PARAM_NO_NOT_BOOLEAN:
    pcStack_10 = "used \'--no-\' for option that is not a boolean";
    break;
  case PARAM_CONTDISP_RESUME_FROM:
    pcStack_10 = "--continue-at and --remote-header-name cannot be combined";
    break;
  case PARAM_READ_ERROR:
    pcStack_10 = "error encountered when reading a file";
    break;
  case PARAM_EXPAND_ERROR:
    pcStack_10 = "variable expansion failure";
    break;
  case PARAM_BLANK_STRING:
    pcStack_10 = "blank argument where content is expected";
    break;
  case PARAM_VAR_SYNTAX:
    pcStack_10 = "syntax error in --variable argument";
  }
  return pcStack_10;
}

Assistant:

const char *param2text(ParameterError error)
{
  switch(error) {
  case PARAM_GOT_EXTRA_PARAMETER:
    return "had unsupported trailing garbage";
  case PARAM_OPTION_UNKNOWN:
    return "is unknown";
  case PARAM_OPTION_AMBIGUOUS:
    return "is ambiguous";
  case PARAM_REQUIRES_PARAMETER:
    return "requires parameter";
  case PARAM_BAD_USE:
    return "is badly used here";
  case PARAM_BAD_NUMERIC:
    return "expected a proper numerical parameter";
  case PARAM_NEGATIVE_NUMERIC:
    return "expected a positive numerical parameter";
  case PARAM_LIBCURL_DOESNT_SUPPORT:
    return "the installed libcurl version does not support this";
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    return "a specified protocol is unsupported by libcurl";
  case PARAM_NO_MEM:
    return "out of memory";
  case PARAM_NO_PREFIX:
    return "the given option cannot be reversed with a --no- prefix";
  case PARAM_NUMBER_TOO_LARGE:
    return "too large number";
  case PARAM_NO_NOT_BOOLEAN:
    return "used '--no-' for option that is not a boolean";
  case PARAM_CONTDISP_RESUME_FROM:
    return "--continue-at and --remote-header-name cannot be combined";
  case PARAM_READ_ERROR:
    return "error encountered when reading a file";
  case PARAM_EXPAND_ERROR:
    return "variable expansion failure";
  case PARAM_BLANK_STRING:
    return "blank argument where content is expected";
  case PARAM_VAR_SYNTAX:
    return "syntax error in --variable argument";
  default:
    return "unknown error";
  }
}